

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFUnit.cpp
# Opt level: O0

DWARFDie __thiscall llvm::DWARFUnit::getPreviousSibling(DWARFUnit *this,DWARFDebugInfoEntry *Die)

{
  uint32_t uVar1;
  uint32_t uVar2;
  reference pvVar3;
  ulong local_38;
  size_t I;
  uint32_t Depth;
  DWARFDebugInfoEntry *Die_local;
  DWARFUnit *this_local;
  
  if (Die == (DWARFDebugInfoEntry *)0x0) {
    memset(&this_local,0,0x10);
    DWARFDie::DWARFDie((DWARFDie *)&this_local);
  }
  else {
    uVar1 = DWARFDebugInfoEntry::getDepth(Die);
    if (uVar1 == 0) {
      memset(&this_local,0,0x10);
      DWARFDie::DWARFDie((DWARFDie *)&this_local);
    }
    else {
      uVar2 = getDIEIndex(this,Die);
      local_38 = (ulong)uVar2;
      do {
        if (local_38 == 0) {
          memset(&this_local,0,0x10);
          DWARFDie::DWARFDie((DWARFDie *)&this_local);
          return _this_local;
        }
        local_38 = local_38 - 1;
        pvVar3 = std::vector<llvm::DWARFDebugInfoEntry,_std::allocator<llvm::DWARFDebugInfoEntry>_>
                 ::operator[](&this->DieArray,local_38);
        uVar2 = DWARFDebugInfoEntry::getDepth(pvVar3);
        if (uVar2 == uVar1 - 1) {
          memset(&this_local,0,0x10);
          DWARFDie::DWARFDie((DWARFDie *)&this_local);
          return _this_local;
        }
        pvVar3 = std::vector<llvm::DWARFDebugInfoEntry,_std::allocator<llvm::DWARFDebugInfoEntry>_>
                 ::operator[](&this->DieArray,local_38);
        uVar2 = DWARFDebugInfoEntry::getDepth(pvVar3);
      } while (uVar2 != uVar1);
      pvVar3 = std::vector<llvm::DWARFDebugInfoEntry,_std::allocator<llvm::DWARFDebugInfoEntry>_>::
               operator[](&this->DieArray,local_38);
      DWARFDie::DWARFDie((DWARFDie *)&this_local,this,pvVar3);
    }
  }
  return _this_local;
}

Assistant:

DWARFDie DWARFUnit::getPreviousSibling(const DWARFDebugInfoEntry *Die) {
  if (!Die)
    return DWARFDie();
  uint32_t Depth = Die->getDepth();
  // Unit DIEs always have a depth of zero and never have siblings.
  if (Depth == 0)
    return DWARFDie();

  // Find the previous DIE whose depth is the same as the Die's depth.
  for (size_t I = getDIEIndex(Die); I > 0;) {
    --I;
    if (DieArray[I].getDepth() == Depth - 1)
      return DWARFDie();
    if (DieArray[I].getDepth() == Depth)
      return DWARFDie(this, &DieArray[I]);
  }
  return DWARFDie();
}